

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zipdir.c
# Opt level: O2

int compress_lzma(Byte *out,uint *outlen,Byte *in,uint inlen)

{
  SRes SVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  size_t comp_len;
  size_t props_size;
  CLzmaEncProps lzma_props;
  
  iVar3 = -1;
  if ((9 < *outlen) && (inlen != 0 && (in != (Byte *)0x0 && out != (Byte *)0x0))) {
    LzmaEncProps_Init(&lzma_props);
    props_size = 5;
    comp_len = (size_t)(*outlen - 9);
    SVar1 = LzmaEncode(out + 9,&comp_len,in,(ulong)inlen,&lzma_props,out + 4,&props_size,0,
                       (ICompressProgress *)0x0,&Alloc,&Alloc);
    if (SVar1 == 0) {
      iVar3 = 0;
      iVar2 = (int)props_size;
      if (props_size != 5) {
        iVar3 = 5 - iVar2;
        for (lVar4 = 8; 9 - iVar2 < lVar4; lVar4 = lVar4 + -1) {
          out[lVar4] = out[lVar4 - iVar3];
        }
      }
      (out + iVar3)[0] = '\x0f';
      (out + iVar3)[1] = '\x0e';
      out[(long)iVar3 + 2] = (Byte)props_size;
      out[(long)iVar3 + 3] = '\0';
      *outlen = iVar2 + (int)comp_len + 4;
    }
  }
  return iVar3;
}

Assistant:

int compress_lzma(Byte *out, unsigned int *outlen, const Byte *in, unsigned int inlen)
{
	CLzmaEncProps lzma_props;
	size_t props_size;
	size_t comp_len;
	int offset;

	if (*outlen < 1 + 4 + LZMA_PROPS_SIZE)
	{
		// Not enough room for LZMA properties header + compressed data.
		return -1;
	}
	if (out == NULL || in == NULL || inlen == 0)
	{
		return -1;
	}

	LzmaEncProps_Init(&lzma_props);
//	lzma_props.level = 9;
	props_size = LZMA_PROPS_SIZE;
	comp_len = *outlen - 4 - LZMA_PROPS_SIZE;

	if (SZ_OK != LzmaEncode(out + 4 + LZMA_PROPS_SIZE, &comp_len, in, inlen, &lzma_props,
		out + 4, &props_size, 0, NULL, &Alloc, &Alloc))
	{
		return -1;
	}
	// Fill in LZMA properties header
	offset = 0;
	if (props_size != LZMA_PROPS_SIZE)
	{
		// Move LZMA properties to be adjacent to the compressed data, because for
		// some reaseon the library didn't use all the space provided.
		int i;

		offset = (int)(LZMA_PROPS_SIZE - props_size);
		for (i = 4 + LZMA_PROPS_SIZE - 1; i > 4 + offset; --i)
		{
			out[i] = out[i - offset];
		}
	}
	out[offset] = MY_VER_MAJOR;
	out[offset+1] = MY_VER_MINOR;
	out[offset+2] = (Byte)props_size;
	out[offset+3] = 0;
	// Add header length to outlen
	*outlen = (unsigned int)(comp_len + 4 + props_size);
	return offset;
}